

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_device_memory_device.cpp
# Opt level: O1

void device_cleanup(void)

{
  rtcReleaseScene(embree::data);
  embree::data = 0;
  embree::alignedUSMFree(DAT_002cfd48);
  DAT_002cfd48 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cfd50);
  DAT_002cfd50 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cfd58);
  DAT_002cfd58 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cfd70);
  DAT_002cfd70 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cfd60);
  DAT_002cfd60 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cfd68);
  DAT_002cfd68 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cfd78);
  DAT_002cfd78 = (void *)0x0;
  return;
}

Assistant:

void device_cleanup ()
{
  TutorialData_Destructor(&data);
}